

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O1

void __thiscall PointBlock<3U>::generate_points(PointBlock<3U> *this,Bounds *domain,size_t n)

{
  float fVar1;
  int iVar2;
  uint j;
  long lVar3;
  long lVar4;
  size_t sVar5;
  
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)&this->box,
             (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)domain);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::operator=
            (&(this->box).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             &(domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>);
  std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::resize
            (&this->points,n);
  if (n != 0) {
    lVar4 = 0;
    sVar5 = 0;
    do {
      lVar3 = 0;
      do {
        fVar1 = (domain->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin
                [lVar3];
        iVar2 = rand();
        *(float *)((long)(((this->points).
                           super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_array<float,_3UL>).
                         _M_elems + lVar3 * 4 + lVar4) =
             ((domain->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin
              [lVar3] -
             (domain->min).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>.m_begin
             [lVar3]) * (float)(iVar2 % 0x400) * 0.0009765625 + fVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + 0xc;
    } while (sVar5 != n);
  }
  return;
}

Assistant:

void            generate_points(const Bounds& domain, // overall data bounds
                                    size_t n)             // number of points
    {
        box = domain;
        points.resize(n);
        for (size_t i = 0; i < n; ++i)
            for (unsigned j = 0; j < DIM; ++j)
                points[i][j] = domain.min[j] + float(rand() % 1024)/1024 *
                    (domain.max[j] - domain.min[j]);
    }